

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis_enc.c
# Opt level: O2

int DoSegmentsJob(void *arg1,void *arg2)

{
  int *piVar1;
  float fVar2;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint32_t *puVar14;
  ulong uVar15;
  uint32_t dc [16];
  uint8_t local_88 [16];
  uint8_t tmp [63];
  
  iVar4 = VP8IteratorIsDone((VP8EncIterator *)arg2);
  if (iVar4 == 0) {
    do {
      VP8IteratorImport((VP8EncIterator *)arg2,tmp + 0x18);
      lVar10 = *(long *)((long)arg2 + 0x28);
      VP8SetIntra16Mode((VP8EncIterator *)arg2,0);
      VP8SetSkip((VP8EncIterator *)arg2,0);
      VP8SetSegment((VP8EncIterator *)arg2,0);
      if (*(int *)(lVar10 + 0x5c40) < 2) {
        fVar2 = *(float *)(**(long **)((long)arg2 + 0x28) + 4);
        lVar10 = 0;
        puVar14 = dc;
        for (uVar11 = 0; uVar11 < 0x10; uVar11 = uVar11 + 4) {
          (*VP8Mean16x4)((uint8_t *)(*(long *)((long)arg2 + 8) + lVar10),puVar14);
          puVar14 = puVar14 + 4;
          lVar10 = lVar10 + 0x80;
        }
        iVar4 = 0;
        iVar8 = 0;
        for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
          uVar3 = dc[lVar10];
          iVar4 = iVar4 + uVar3;
          iVar8 = iVar8 + uVar3 * uVar3;
        }
        if ((uint)(iVar8 * (((int)fVar2 * 9) / 100 + 8)) < (uint)(iVar4 * iVar4)) {
          VP8SetIntra16Mode((VP8EncIterator *)arg2,0);
        }
        else {
          local_88[0] = '\0';
          local_88[1] = '\0';
          local_88[2] = '\0';
          local_88[3] = '\0';
          local_88[4] = '\0';
          local_88[5] = '\0';
          local_88[6] = '\0';
          local_88[7] = '\0';
          local_88[8] = '\0';
          local_88[9] = '\0';
          local_88[10] = '\0';
          local_88[0xb] = '\0';
          local_88[0xc] = '\0';
          local_88[0xd] = '\0';
          local_88[0xe] = '\0';
          local_88[0xf] = '\0';
          VP8SetIntra4Mode((VP8EncIterator *)arg2,local_88);
        }
        iVar4 = 2;
      }
      else {
        VP8MakeLuma16Preds((VP8EncIterator *)arg2);
        uVar11 = 0xffffffff;
        uVar15 = 0;
        for (uVar12 = 0; uVar12 != 2; uVar12 = uVar12 + 1) {
          dc[0] = 0;
          dc[1] = 1;
          uVar13 = 0;
          (*VP8CollectHistogram)
                    (*(uint8_t **)((long)arg2 + 8),
                     (uint8_t *)((ulong)VP8I16ModeOffsets[uVar12] + *(long *)((long)arg2 + 0x20)),0,
                     0x10,(VP8Histogram *)dc);
          if (1 < (int)dc[0]) {
            uVar13 = (long)(int)(dc[1] * 0x1fe) / (long)(int)dc[0] & 0xffffffff;
          }
          if ((int)uVar11 < (int)uVar13) {
            uVar15 = uVar12 & 0xffffffff;
            uVar11 = uVar13;
          }
        }
        VP8SetIntra16Mode((VP8EncIterator *)arg2,(int)uVar15);
        iVar4 = (int)uVar11 * 3 + 2;
      }
      VP8MakeChroma8Preds((VP8EncIterator *)arg2);
      uVar11 = 0xffffffffffffffff;
      iVar8 = 0;
      iVar9 = 0;
      for (lVar10 = 0; iVar7 = (int)uVar11, lVar10 != 2; lVar10 = lVar10 + 1) {
        dc[0] = 0;
        dc[1] = 1;
        (*VP8CollectHistogram)
                  ((uint8_t *)(*(long *)((long)arg2 + 8) + 0x10),
                   (uint8_t *)((ulong)VP8UVModeOffsets[lVar10] + *(long *)((long)arg2 + 0x20)),0x10,
                   0x18,(VP8Histogram *)dc);
        uVar12 = 0;
        if (1 < (int)dc[0]) {
          uVar12 = (long)(int)(dc[1] * 0x1fe) / (long)(int)dc[0] & 0xffffffff;
        }
        iVar5 = (int)uVar12;
        uVar11 = uVar11 & 0xffffffff;
        if (iVar7 < iVar5) {
          uVar11 = uVar12;
        }
        iVar7 = (int)lVar10;
        if (iVar9 <= iVar5 && lVar10 != 0) {
          iVar7 = iVar8;
          iVar5 = iVar9;
        }
        iVar8 = iVar7;
        iVar9 = iVar5;
      }
      VP8SetIntraUVMode((VP8EncIterator *)arg2,iVar8);
      iVar4 = iVar4 + iVar7 >> 2;
      uVar6 = 0xff - iVar4;
      if (0xfe < uVar6) {
        uVar6 = 0xff;
      }
      uVar11 = (ulong)uVar6;
      if (0xff < iVar4) {
        uVar11 = 0;
      }
      piVar1 = (int *)((long)arg1 + uVar11 * 4 + 0x30);
      *piVar1 = *piVar1 + 1;
      *(char *)(*(long *)((long)arg2 + 0x30) + 1) = (char)uVar11;
      *(int *)((long)arg1 + 0x430) = *(int *)((long)arg1 + 0x430) + (int)uVar11;
      *(int *)((long)arg1 + 0x434) = *(int *)((long)arg1 + 0x434) + iVar7;
      iVar4 = VP8IteratorProgress((VP8EncIterator *)arg2,*(int *)((long)arg1 + 0x1340));
    } while ((iVar4 != 0) && (iVar8 = VP8IteratorNext((VP8EncIterator *)arg2), iVar8 != 0));
  }
  else {
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

static int DoSegmentsJob(void* arg1, void* arg2) {
  SegmentJob* const job = (SegmentJob*)arg1;
  VP8EncIterator* const it = (VP8EncIterator*)arg2;
  int ok = 1;
  if (!VP8IteratorIsDone(it)) {
    uint8_t tmp[32 + WEBP_ALIGN_CST];
    uint8_t* const scratch = (uint8_t*)WEBP_ALIGN(tmp);
    do {
      // Let's pretend we have perfect lossless reconstruction.
      VP8IteratorImport(it, scratch);
      MBAnalyze(it, job->alphas, &job->alpha, &job->uv_alpha);
      ok = VP8IteratorProgress(it, job->delta_progress);
    } while (ok && VP8IteratorNext(it));
  }
  return ok;
}